

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

Scl_Item_t * Scl_LibertyReadPinTiming(Scl_Tree_t *p,Scl_Item_t *pPinOut,char *pNameIn)

{
  int iVar1;
  char *__s1;
  Scl_Item_t *local_38;
  Scl_Item_t *pPinIn;
  Scl_Item_t *pTiming;
  char *pNameIn_local;
  Scl_Item_t *pPinOut_local;
  Scl_Tree_t *p_local;
  
  pPinIn = Scl_LibertyItem(p,pPinOut->Child);
  do {
    if (pPinIn == (Scl_Item_t *)0x0) {
      return (Scl_Item_t *)0x0;
    }
    iVar1 = Scl_LibertyCompare(p,pPinIn->Key,"timing");
    if (iVar1 == 0) {
      for (local_38 = Scl_LibertyItem(p,pPinIn->Child); local_38 != (Scl_Item_t *)0x0;
          local_38 = Scl_LibertyItem(p,local_38->Next)) {
        iVar1 = Scl_LibertyCompare(p,local_38->Key,"related_pin");
        if (iVar1 == 0) {
          __s1 = Scl_LibertyReadString(p,local_38->Head);
          iVar1 = strcmp(__s1,pNameIn);
          if (iVar1 == 0) {
            return pPinIn;
          }
        }
      }
    }
    pPinIn = Scl_LibertyItem(p,pPinIn->Next);
  } while( true );
}

Assistant:

Scl_Item_t * Scl_LibertyReadPinTiming( Scl_Tree_t * p, Scl_Item_t * pPinOut, char * pNameIn )
{
    Scl_Item_t * pTiming, * pPinIn;
    Scl_ItemForEachChildName( p, pPinOut, pTiming, "timing" )
        Scl_ItemForEachChildName( p, pTiming, pPinIn, "related_pin" )
            if ( !strcmp(Scl_LibertyReadString(p, pPinIn->Head), pNameIn) )
                return pTiming;
    return NULL;
}